

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O0

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
min_function::evaluate
          (min_function *this,
          vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          *args,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *context,error_code *ec)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  size_type sVar4;
  unsigned_long *puVar5;
  undefined8 uVar6;
  const_reference pvVar7;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar8;
  reference pbVar9;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RCX;
  undefined1 uVar10;
  vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  *in_RSI;
  function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *in_RDI
  ;
  optional<unsigned_long> oVar11;
  size_t i;
  size_t index;
  bool is_string;
  bool is_number;
  reference arg0;
  string *in_stack_ffffffffffffff38;
  assertion_error *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  jmespath_errc jVar12;
  eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff50;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  allocator<char> *in_stack_ffffffffffffff70;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar13;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar14;
  char *in_stack_ffffffffffffff78;
  undefined6 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffd1;
  reference local_8;
  
  jVar12 = (jmespath_errc)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  sVar4 = std::
          vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          ::size(in_RSI);
  oVar11 = function_base<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           ::arity(in_RDI);
  uVar10 = oVar11.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_engaged;
  puVar5 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x4d90ac);
  if (sVar4 != *puVar5) {
    uVar6 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff87,
                        CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)),
               in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    assertion_error::assertion_error(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    __cxa_throw(uVar6,&assertion_error::typeinfo,assertion_error::~assertion_error);
  }
  pvVar7 = std::
           vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           ::operator[](in_RSI,0);
  bVar1 = parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
          is_value(pvVar7);
  if (bVar1) {
    pvVar7 = std::
             vector<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
             ::operator[](in_RSI,0);
    parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::value
              (pvVar7);
    bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                      (in_stack_ffffffffffffff58);
    if (bVar1) {
      bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::empty
                        (in_stack_ffffffffffffffb8);
      if (bVar1) {
        local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  ::null_value(in_stack_ffffffffffffff50);
      }
      else {
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                  (in_RCX,CONCAT71(in_stack_ffffffffffffffd1,uVar10));
        bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number
                          (in_stack_ffffffffffffff58);
        basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                  (in_RCX,CONCAT71(in_stack_ffffffffffffffd1,uVar10));
        bVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                          (in_stack_ffffffffffffff58);
        if (((bVar2 & 1) != 0) || ((bool)bVar3)) {
          pbVar13 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x1;
          while (pbVar14 = pbVar13,
                pbVar8 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                                   (pbVar13), pbVar13 < pbVar8) {
            basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                      (in_RCX,CONCAT71(in_stack_ffffffffffffffd1,uVar10));
            jVar12 = (jmespath_errc)((ulong)pbVar13 >> 0x20);
            bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number
                              (in_stack_ffffffffffffff58);
            if (bVar1 != (bool)(bVar2 & 1)) {
LAB_004d9343:
              std::error_code::operator=((error_code *)in_stack_ffffffffffffff50,jVar12);
              pbVar9 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                       ::null_value(in_stack_ffffffffffffff50);
              return pbVar9;
            }
            basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                      (in_RCX,CONCAT71(in_stack_ffffffffffffffd1,uVar10));
            bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                              (in_stack_ffffffffffffff58);
            if (bVar1 != (bool)(bVar3 & 1)) goto LAB_004d9343;
            pbVar13 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                                (in_RCX,CONCAT71(in_stack_ffffffffffffffd1,uVar10));
            basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                      (in_RCX,CONCAT71(in_stack_ffffffffffffffd1,uVar10));
            jsoncons::operator<(pbVar13,(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>
                                         *)in_stack_ffffffffffffff38);
            pbVar13 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                      ((long)&pbVar14->field_0 + 1);
          }
          local_8 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                              (in_RCX,CONCAT71(in_stack_ffffffffffffffd1,uVar10));
        }
        else {
          std::error_code::operator=((error_code *)in_stack_ffffffffffffff50,jVar12);
          local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    ::null_value(in_stack_ffffffffffffff50);
        }
      }
    }
    else {
      std::error_code::operator=((error_code *)in_stack_ffffffffffffff50,jVar12);
      local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                ::null_value(in_stack_ffffffffffffff50);
    }
  }
  else {
    std::error_code::operator=((error_code *)in_stack_ffffffffffffff50,jVar12);
    local_8 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
              ::null_value(in_stack_ffffffffffffff50);
  }
  return local_8;
}

Assistant:

reference evaluate(const std::vector<parameter_type>& args, eval_context<Json>& context, std::error_code& ec) const override
            {
                JSONCONS_ASSERT(args.size() == *this->arity());

                if (!args[0].is_value())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                reference arg0 = args[0].value();
                if (!arg0.is_array())
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }
                if (arg0.empty())
                {
                    return context.null_value();
                }

                bool is_number = arg0.at(0).is_number();
                bool is_string = arg0.at(0).is_string();
                if (!is_number && !is_string)
                {
                    ec = jmespath_errc::invalid_type;
                    return context.null_value();
                }

                std::size_t index = 0;
                for (std::size_t i = 1; i < arg0.size(); ++i)
                {
                    if (!(arg0.at(i).is_number() == is_number && arg0.at(i).is_string() == is_string))
                    {
                        ec = jmespath_errc::invalid_type;
                        return context.null_value();
                    }
                    if (arg0.at(i) < arg0.at(index))
                    {
                        index = i;
                    }
                }

                return arg0.at(index);
            }